

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

scalar_function_t *
duckdb::GetScalarBinaryFunction<duckdb::DecimalMultiplyOverflowCheck>
          (scalar_function_t *__return_storage_ptr__,PhysicalType type)

{
  NotImplementedException *this;
  PhysicalType type_00;
  int iVar1;
  undefined7 in_register_00000031;
  allocator local_89;
  string local_88;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  string local_40;
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 == 0xc) {
    local_88._M_dataplus._M_p =
         (pointer)ScalarFunction::
                  BinaryFunction<double,double,double,duckdb::DecimalMultiplyOverflowCheck>;
  }
  else {
    if (iVar1 != 0xb) {
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_58 = 0;
      uStack_50 = 0;
      switch(type) {
      case UINT8:
        local_88._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::DecimalMultiplyOverflowCheck>
        ;
        break;
      case INT8:
        local_88._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<signed_char,signed_char,signed_char,duckdb::DecimalMultiplyOverflowCheck>
        ;
        break;
      case UINT16:
        local_88._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::DecimalMultiplyOverflowCheck>
        ;
        break;
      case INT16:
        local_88._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<short,short,short,duckdb::DecimalMultiplyOverflowCheck>;
        break;
      case UINT32:
        local_88._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::DecimalMultiplyOverflowCheck>
        ;
        break;
      case INT32:
        local_88._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<int,int,int,duckdb::DecimalMultiplyOverflowCheck>;
        break;
      case UINT64:
        local_88._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::DecimalMultiplyOverflowCheck>
        ;
        break;
      case INT64:
        local_88._M_dataplus._M_p =
             (pointer)ScalarFunction::
                      BinaryFunction<long,long,long,duckdb::DecimalMultiplyOverflowCheck>;
        break;
      default:
        if (type == UINT128) {
          local_88._M_dataplus._M_p =
               (pointer)ScalarFunction::
                        BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::DecimalMultiplyOverflowCheck>
          ;
        }
        else {
          if (type != INT128) {
            this = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_88,"Unimplemented type for GetScalarBinaryFunction: %s",
                       &local_89);
            TypeIdToString_abi_cxx11_(&local_40,(duckdb *)(ulong)type,type_00);
            NotImplementedException::NotImplementedException<std::__cxx11::string>
                      (this,&local_88,&local_40);
            __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          local_88._M_dataplus._M_p =
               (pointer)ScalarFunction::
                        BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::DecimalMultiplyOverflowCheck>
          ;
        }
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 local_68._M_pod_data,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&local_88);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      operator=(__return_storage_ptr__,
                (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )&local_68);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
      return __return_storage_ptr__;
    }
    local_88._M_dataplus._M_p =
         (pointer)ScalarFunction::
                  BinaryFunction<float,float,float,duckdb::DecimalMultiplyOverflowCheck>;
  }
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             __return_storage_ptr__,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&local_88);
  return __return_storage_ptr__;
}

Assistant:

static scalar_function_t GetScalarBinaryFunction(PhysicalType type) {
	scalar_function_t function;
	switch (type) {
	case PhysicalType::FLOAT:
		function = &ScalarFunction::BinaryFunction<float, float, float, OP>;
		break;
	case PhysicalType::DOUBLE:
		function = &ScalarFunction::BinaryFunction<double, double, double, OP>;
		break;
	default:
		function = GetScalarIntegerFunction<OP>(type);
		break;
	}
	return function;
}